

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>_>
* __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
::equal_range(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>_>
              *__return_storage_ptr__,
             base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             *this,key_type *key)

{
  undefined8 uVar1;
  undefined4 uVar2;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  tree_iter;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  tree_iter_00;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar3;
  iterator iVar4;
  iterator iVar5;
  
  pVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range(&(this->checker_)._M_t,key);
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
          lower_bound<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                            *)this,key);
  iVar5 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
          upper_bound<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                            *)this,key);
  (__return_storage_ptr__->first).node = iVar4.node;
  (__return_storage_ptr__->first).position = iVar4.position;
  (__return_storage_ptr__->second).node = iVar5.node;
  (__return_storage_ptr__->second).position = iVar5.position;
  tree_iter._12_4_ = 0;
  tree_iter.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        *)SUB128(iVar4._0_12_,0);
  tree_iter.position = SUB124(iVar4._0_12_,8);
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
            ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
              *)this,tree_iter,(_Base_ptr)pVar3.first._M_node);
  uVar1 = (__return_storage_ptr__->second).node;
  uVar2 = (__return_storage_ptr__->second).position;
  tree_iter_00.position = uVar2;
  tree_iter_00.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
        *)uVar1;
  tree_iter_00._12_4_ = 0;
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
            ((base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
              *)this,tree_iter_00,(_Base_ptr)pVar3.second._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_type &key) {
        std::pair<typename CheckerType::iterator, typename CheckerType::iterator>
            checker_res = checker_.equal_range(key);
        std::pair<iterator, iterator> tree_res = tree_.equal_range(key);
        iter_check(tree_res.first, checker_res.first);
        iter_check(tree_res.second, checker_res.second);
        return tree_res;
    }